

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

_tExecReaction __thiscall yactfr::internal::Vm::_execReadFlBitArrayBeRev(Vm *this,Instr *instr)

{
  unsigned_long val;
  
  val = _readFlInt<unsigned_long,_yactfr::internal::(anonymous_namespace)::readFlUIntBeFuncs,_true>
                  (this,instr);
  _setBitArrayElemBase<unsigned_long,yactfr::FixedLengthBitArrayElement>
            (this,val,instr,&(this->_pos).elems.flBitArray);
  _consumeExistingBits(this,(ulong)*(uint *)((long)&instr[2]._vptr_Instr + 4));
  return FetchNextInstrAndStop;
}

Assistant:

Vm::_tExecReaction Vm::_execReadFlBitArrayBeRev(const Instr& instr)
{
    this->_execReadFlBitArray<readFlUIntBeFuncs, true>(instr);
    return _tExecReaction::FetchNextInstrAndStop;
}